

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_fload(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  int iVar5;
  TRef TVar6;
  uint uVar7;
  ulong uVar8;
  uint local_38;
  uint local_34;
  
  uVar1 = (J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  uVar7 = (uint)J->chain[0x4d];
  local_34 = (uint)uVar1;
  do {
    if (uVar7 < uVar1 || uVar7 == uVar1) {
      if ((IVar2 == 7) &&
         (0xfd < (byte)(*(char *)((long)(J->cur).ir + (ulong)(uint)uVar1 * 8 + 5) + 0xadU))) {
        TVar6 = lj_ir_knull(J,IRT_TAB);
        return TVar6;
      }
      goto LAB_00157365;
    }
    pIVar3 = (J->cur).ir;
    uVar8 = (ulong)uVar7;
    AVar4 = aa_fref(J,&(J->fold).ins,pIVar3 + pIVar3[uVar8].field_0.op1);
    if (AVar4 == ALIAS_MAY) {
      iVar5 = 5;
      local_34 = uVar7;
    }
    else if (AVar4 == ALIAS_MUST) {
      local_38 = (uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 2);
      iVar5 = 1;
    }
    else {
      uVar7 = (uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
      iVar5 = 0;
    }
  } while (iVar5 == 0);
  if (iVar5 != 5) {
    return local_38;
  }
LAB_00157365:
  TVar6 = lj_opt_cselim(J,local_34);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_fload(jit_State *J)
{
  IRRef oref = fins->op1;  /* Object reference. */
  IRRef fid = fins->op2;  /* Field ID. */
  IRRef lim = oref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_FSTORE];
  while (ref > oref) {
    IRIns *store = IR(ref);
    switch (aa_fref(J, fins, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store: const-fold field loads from allocations. */
  if (fid == IRFL_TAB_META) {
    IRIns *ir = IR(oref);
    if (ir->o == IR_TNEW || ir->o == IR_TDUP)
      return lj_ir_knull(J, IRT_TAB);
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}